

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

Symbol * slang::ast::InstanceSymbol::createDefaultNested
                   (Scope *scope,ModuleDeclarationSyntax *syntax)

{
  Token *this;
  Compilation *comp;
  ModuleHeaderSyntax *pMVar1;
  Symbol *pSVar2;
  undefined1 auVar3 [16];
  int iVar4;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar5;
  undefined4 extraout_var;
  HierarchyInstantiationSyntax *syntax_00;
  EVP_PKEY_CTX *src;
  InstanceNameSyntax *instName;
  SmallVector<const_slang::ast::Symbol_*,_5UL> results;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets;
  undefined1 local_e0 [16];
  bitmask<slang::ast::ASTFlags> local_d0;
  Symbol *pSStack_c8;
  TempVarSymbol *local_c0;
  RandomizeDetails *pRStack_b8;
  AssertionInstanceDetails *local_b0;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> instances;
  
  comp = scope->compilation;
  instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  pMVar1 = (syntax->header).ptr;
  this = &pMVar1->name;
  location = parsing::Token::location(this);
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>._0_16_ = ZEXT816(0);
  instName = BumpAllocator::
             emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token&,std::span<slang::syntax::VariableDimensionSyntax*,18446744073709551615ul>>
                       (&comp->super_BumpAllocator,this,
                        (span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                        &results);
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>._0_16_ =
       parsing::Token::createMissing(&comp->super_BumpAllocator,OpenParenthesis,location);
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)0x0;
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
  local_e0 = (undefined1  [16])
             parsing::Token::createMissing(&comp->super_BumpAllocator,CloseParenthesis,location);
  pHVar5 = BumpAllocator::
           emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
                     (&comp->super_BumpAllocator,&instName,(Token *)&results,
                      (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&implicitNets,
                      (Token *)local_e0);
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap =
       CONCAT71(results.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap._1_7_,1);
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pHVar5;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
            (&instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (TokenOrSyntax *)&results);
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>._0_16_ = ZEXT816(0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_e0._8_8_;
  local_e0 = auVar3 << 0x40;
  iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)comp,src);
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
       (pointer)CONCAT44(extraout_var,iVar4);
  syntax_00 = BumpAllocator::
              emplace<slang::syntax::HierarchyInstantiationSyntax,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token&,decltype(nullptr),std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                        (&comp->super_BumpAllocator,
                         (span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                         &results,this,(void **)local_e0,
                         (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&implicitNets
                         ,&pMVar1->semi);
  local_e0._8_4_ = 0xffffffff;
  local_e0._0_8_ = scope;
  local_d0.m_bits = 0;
  pSStack_c8 = (Symbol *)0x0;
  local_c0 = (TempVarSymbol *)0x0;
  pRStack_b8 = (RandomizeDetails *)0x0;
  local_b0 = (AssertionInstanceDetails *)0x0;
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
       (pointer)results.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
  results.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
       (pointer)implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
  fromSyntax(comp,syntax_00,(ASTContext *)local_e0,
             &results.super_SmallVectorBase<const_slang::ast::Symbol_*>,
             &implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>,
             (BindDirectiveInfo *)0x0,(SyntaxNode *)syntax);
  pSVar2 = *results.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_;
  if (pSVar2->kind == Instance) {
    pSVar2->originatingSyntax = (SyntaxNode *)syntax;
  }
  SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
            (&implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>,
             (EVP_PKEY_CTX *)syntax_00);
  SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
            (&results.super_SmallVectorBase<const_slang::ast::Symbol_*>,(EVP_PKEY_CTX *)syntax_00);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)syntax_00);
  return pSVar2;
}

Assistant:

Symbol& InstanceSymbol::createDefaultNested(const Scope& scope,
                                            const ModuleDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto missing = [&](TokenKind tk, SourceLocation loc) {
        return Token::createMissing(comp, tk, loc);
    };

    // Fabricate a fake instantiation syntax to let us reuse all of the real logic
    // with this nested module case as well.
    SmallVector<TokenOrSyntax, 4> instances;
    auto& header = *syntax.header;
    auto loc = header.name.location();
    auto instName = comp.emplace<InstanceNameSyntax>(header.name,
                                                     std::span<VariableDimensionSyntax*>());
    auto instance = comp.emplace<HierarchicalInstanceSyntax>(
        instName, missing(TokenKind::OpenParenthesis, loc), std::span<TokenOrSyntax>(),
        missing(TokenKind::CloseParenthesis, loc));

    instances.push_back(instance);

    auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
        std::span<AttributeInstanceSyntax*>(), header.name, nullptr, instances.copy(comp),
        header.semi);

    ASTContext context(scope, LookupLocation::max);
    SmallVector<const Symbol*> results;
    SmallVector<const Symbol*> implicitNets;
    fromSyntax(comp, *instantiation, context, results, implicitNets, nullptr, &syntax);
    SLANG_ASSERT(implicitNets.empty());
    SLANG_ASSERT(results.size() == 1);

    // We just created this symbol; it's safe to const cast it here.
    auto& result = const_cast<Symbol&>(*results[0]);

    // Swap the syntax back to our original definition syntax
    // so that it's findable in bind directives via the original
    // syntax and not one we just made up.
    if (result.kind == SymbolKind::Instance)
        result.setSyntax(syntax);
    return result;
}